

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_vacuum.cpp
# Opt level: O2

VacuumOptions duckdb::ParseOptions(int32_t options)

{
  NotImplementedException *pNVar1;
  allocator local_39;
  string local_38;
  
  if ((options & 4U) != 0) {
    pNVar1 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string((string *)&local_38,"Verbose vacuum option",&local_39);
    NotImplementedException::NotImplementedException(pNVar1,&local_38);
    __cxa_throw(pNVar1,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if ((options & 8U) != 0) {
    pNVar1 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string((string *)&local_38,"Freeze vacuum option",&local_39);
    NotImplementedException::NotImplementedException(pNVar1,&local_38);
    __cxa_throw(pNVar1,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if ((options & 0x10U) != 0) {
    pNVar1 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string((string *)&local_38,"Full vacuum option",&local_39);
    NotImplementedException::NotImplementedException(pNVar1,&local_38);
    __cxa_throw(pNVar1,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if ((options & 0x20U) == 0) {
    if ((options & 0x40U) != 0) {
      pNVar1 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string((string *)&local_38,"Skip Toast vacuum option",&local_39);
      NotImplementedException::NotImplementedException(pNVar1,&local_38);
      __cxa_throw(pNVar1,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (-1 < (char)options) {
      return (VacuumOptions)((ushort)((options & 2U) << 7) | (ushort)options & 1);
    }
    pNVar1 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_38,"Disable Page Skipping vacuum option",&local_39);
    NotImplementedException::NotImplementedException(pNVar1,&local_38);
    __cxa_throw(pNVar1,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pNVar1 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_38,"No Wait vacuum option",&local_39);
  NotImplementedException::NotImplementedException(pNVar1,&local_38);
  __cxa_throw(pNVar1,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

VacuumOptions ParseOptions(const int32_t options) {
	VacuumOptions result;
	if (options & duckdb_libpgquery::PGVacuumOption::PG_VACOPT_VACUUM) {
		result.vacuum = true;
	}
	if (options & duckdb_libpgquery::PGVacuumOption::PG_VACOPT_ANALYZE) {
		result.analyze = true;
	}
	if (options & duckdb_libpgquery::PGVacuumOption::PG_VACOPT_VERBOSE) {
		throw NotImplementedException("Verbose vacuum option");
	}
	if (options & duckdb_libpgquery::PGVacuumOption::PG_VACOPT_FREEZE) {
		throw NotImplementedException("Freeze vacuum option");
	}
	if (options & duckdb_libpgquery::PGVacuumOption::PG_VACOPT_FULL) {
		throw NotImplementedException("Full vacuum option");
	}
	if (options & duckdb_libpgquery::PGVacuumOption::PG_VACOPT_NOWAIT) {
		throw NotImplementedException("No Wait vacuum option");
	}
	if (options & duckdb_libpgquery::PGVacuumOption::PG_VACOPT_SKIPTOAST) {
		throw NotImplementedException("Skip Toast vacuum option");
	}
	if (options & duckdb_libpgquery::PGVacuumOption::PG_VACOPT_DISABLE_PAGE_SKIPPING) {
		throw NotImplementedException("Disable Page Skipping vacuum option");
	}
	return result;
}